

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm1d_sse4.h
# Opt level: O2

void transpose_32(int txfm_size,__m128i *input,__m128i *output)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  __m128i *palVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  __m128i *palVar26;
  __m128i *palVar27;
  
  iVar3 = (int)((long)txfm_size / 4);
  lVar20 = (long)iVar3;
  lVar24 = 0;
  uVar25 = 0;
  if (0 < iVar3) {
    uVar25 = (long)txfm_size / 4 & 0xffffffff;
  }
  palVar22 = input + iVar3 * 3;
  palVar27 = input + lVar20;
  palVar26 = input + iVar3 * 2;
  for (; lVar24 < txfm_size; lVar24 = lVar24 + 4) {
    iVar23 = 0;
    for (lVar21 = 0; uVar25 * 0x10 != lVar21; lVar21 = lVar21 + 0x10) {
      lVar19 = lVar24 * 4;
      puVar1 = (undefined4 *)((long)*input + lVar21);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = (undefined4 *)((long)*palVar26 + lVar21);
      uVar7 = *puVar2;
      uVar8 = puVar2[1];
      uVar9 = puVar2[2];
      uVar10 = puVar2[3];
      puVar2 = (undefined4 *)((long)*palVar27 + lVar21);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      uVar14 = puVar2[3];
      puVar2 = (undefined4 *)((long)*palVar22 + lVar21);
      uVar15 = *puVar2;
      uVar16 = puVar2[1];
      uVar17 = puVar2[2];
      uVar18 = puVar2[3];
      puVar2 = (undefined4 *)((long)output[iVar23] + lVar24 * 4);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar2[2] = uVar7;
      puVar2[3] = uVar15;
      puVar1 = (undefined4 *)((long)output[iVar23 + lVar20] + lVar19);
      *puVar1 = uVar4;
      puVar1[1] = uVar12;
      puVar1[2] = uVar8;
      puVar1[3] = uVar16;
      puVar1 = (undefined4 *)((long)output[(long)iVar23 + (long)(iVar3 * 2)] + lVar19);
      *puVar1 = uVar5;
      puVar1[1] = uVar13;
      puVar1[2] = uVar9;
      puVar1[3] = uVar17;
      puVar1 = (undefined4 *)((long)output[(long)iVar23 + (long)(iVar3 * 3)] + lVar19);
      *puVar1 = uVar6;
      puVar1[1] = uVar14;
      puVar1[2] = uVar10;
      puVar1[3] = uVar18;
      iVar23 = iVar23 + iVar3 * 4;
    }
    palVar22 = palVar22 + lVar20 * 4;
    palVar27 = palVar27 + lVar20 * 4;
    palVar26 = palVar26 + lVar20 * 4;
    input = input + lVar20 * 4;
  }
  return;
}

Assistant:

static inline void transpose_32(int txfm_size, const __m128i *input,
                                __m128i *output) {
  const int num_per_128 = 4;
  const int row_size = txfm_size;
  const int col_size = txfm_size / num_per_128;
  int r, c;

  // transpose each 4x4 block internally
  for (r = 0; r < row_size; r += 4) {
    for (c = 0; c < col_size; c++) {
      transpose_32_4x4(col_size, &input[r * col_size + c],
                       &output[c * 4 * col_size + r / 4]);
    }
  }
}